

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void wstran_pipe_send_cb(void *arg)

{
  nni_aio *aio;
  nng_err result;
  int rv;
  nni_aio *uaio;
  nni_aio *taio;
  ws_pipe *p;
  void *arg_local;
  
  nni_mtx_lock((nni_mtx *)arg);
  aio = *(nni_aio **)((long)arg + 0x30);
  *(undefined8 *)((long)arg + 0x30) = 0;
  if (aio != (nni_aio *)0x0) {
    result = nni_aio_result((nni_aio *)((long)arg + 0x40));
    if (result == NNG_OK) {
      nni_aio_finish(aio,NNG_OK,0);
    }
    else {
      nni_aio_finish_error(aio,result);
    }
  }
  nni_mtx_unlock((nni_mtx *)arg);
  return;
}

Assistant:

static void
wstran_pipe_send_cb(void *arg)
{
	ws_pipe *p    = arg;
	nni_aio *taio = &p->txaio;
	nni_aio *uaio;

	nni_mtx_lock(&p->mtx);
	uaio          = p->user_txaio;
	p->user_txaio = NULL;

	if (uaio != NULL) {
		int rv;
		if ((rv = nni_aio_result(taio)) != 0) {
			nni_aio_finish_error(uaio, rv);
		} else {
			nni_aio_finish(uaio, 0, 0);
		}
	}
	nni_mtx_unlock(&p->mtx);
}